

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElementsTable.cpp
# Opt level: O0

void __thiscall OpenMD::ElementsTable::~ElementsTable(ElementsTable *this)

{
  bool bVar1;
  iterator this_00;
  reference ppEVar2;
  long in_RDI;
  iterator i;
  vector<OpenMD::Element_*,_std::allocator<OpenMD::Element_*>_> *in_stack_ffffffffffffffc8;
  Element *in_stack_ffffffffffffffd0;
  __normal_iterator<OpenMD::Element_**,_std::vector<OpenMD::Element_*,_std::allocator<OpenMD::Element_*>_>_>
  local_10 [2];
  
  __gnu_cxx::
  __normal_iterator<OpenMD::Element_**,_std::vector<OpenMD::Element_*,_std::allocator<OpenMD::Element_*>_>_>
  ::__normal_iterator(local_10);
  local_10[0]._M_current =
       (Element **)
       std::vector<OpenMD::Element_*,_std::allocator<OpenMD::Element_*>_>::begin
                 (in_stack_ffffffffffffffc8);
  while( true ) {
    this_00 = std::vector<OpenMD::Element_*,_std::allocator<OpenMD::Element_*>_>::end
                        (in_stack_ffffffffffffffc8);
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<OpenMD::Element_**,_std::vector<OpenMD::Element_*,_std::allocator<OpenMD::Element_*>_>_>
                        *)in_stack_ffffffffffffffd0,
                       (__normal_iterator<OpenMD::Element_**,_std::vector<OpenMD::Element_*,_std::allocator<OpenMD::Element_*>_>_>
                        *)in_stack_ffffffffffffffc8);
    if (!bVar1) break;
    ppEVar2 = __gnu_cxx::
              __normal_iterator<OpenMD::Element_**,_std::vector<OpenMD::Element_*,_std::allocator<OpenMD::Element_*>_>_>
              ::operator*(local_10);
    in_stack_ffffffffffffffd0 = *ppEVar2;
    if (in_stack_ffffffffffffffd0 != (Element *)0x0) {
      Element::~Element(in_stack_ffffffffffffffd0);
      operator_delete(in_stack_ffffffffffffffd0,0xa0);
    }
    __gnu_cxx::
    __normal_iterator<OpenMD::Element_**,_std::vector<OpenMD::Element_*,_std::allocator<OpenMD::Element_*>_>_>
    ::operator++(local_10);
  }
  std::vector<OpenMD::Element_*,_std::allocator<OpenMD::Element_*>_>::~vector
            ((vector<OpenMD::Element_*,_std::allocator<OpenMD::Element_*>_> *)this_00._M_current);
  std::__cxx11::string::~string((string *)(in_RDI + 0x68));
  std::__cxx11::string::~string((string *)(in_RDI + 0x48));
  std::__cxx11::string::~string((string *)(in_RDI + 0x28));
  std::__cxx11::string::~string((string *)(in_RDI + 8));
  return;
}

Assistant:

ElementsTable::~ElementsTable() {
    std::vector<Element*>::iterator i;
    for (i = elements_.begin(); i != elements_.end(); ++i)
      delete *i;
  }